

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::isolatePostModifier(string *unit_string,string *modifier)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  undefined1 *puVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool local_62;
  bool local_61;
  size_type divloc2;
  size_type divloc;
  bool skip;
  size_type nspace;
  size_type kloc;
  size_type modfind;
  bool modified;
  string *modifier_local;
  string *unit_string_local;
  
  modfind._7_1_ = false;
  uVar3 = std::__cxx11::string::find((string *)unit_string,(ulong)modifier);
  if (uVar3 != 0xffffffffffffffff) {
    cVar8 = (char)unit_string;
    std::__cxx11::string::find_last_not_of(cVar8,0x20);
    uVar4 = std::__cxx11::string::find_last_of((char *)unit_string,0x1da5bf);
    bVar9 = true;
    if (uVar4 != 0) {
      uVar5 = std::__cxx11::string::size();
      bVar9 = true;
      if (uVar4 < uVar5) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar9 = *pcVar6 != ' ';
      }
    }
    if (!bVar9) {
      local_61 = true;
      if (!bVar9) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        local_61 = isOperator(*pcVar6);
      }
      bVar1 = local_61 != false;
      local_62 = true;
      if (!bVar9 && !bVar1) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        local_62 = isOperator(*pcVar6);
      }
      bVar2 = local_62 != false;
      bVar10 = true;
      if ((!bVar9 && !bVar1) && !bVar2) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar10 = *pcVar6 == ')';
      }
      bVar11 = true;
      if (((!bVar9 && !bVar1) && !bVar2) && !bVar10) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar11 = *pcVar6 == '-';
      }
      bVar12 = true;
      if ((((!bVar9 && !bVar1) && !bVar2) && !bVar10) && !bVar11) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar12 = *pcVar6 == ')';
      }
      bVar13 = true;
      if (((((!bVar9 && !bVar1) && !bVar2) && !bVar10) && !bVar11) && !bVar12) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar13 = *pcVar6 == '-';
      }
      bVar9 = (((((bVar9 || bVar1) || bVar2) || bVar10) || bVar11) || bVar12) || bVar13;
    }
    if ((!bVar9) && (uVar5 = std::__cxx11::string::find_last_of(cVar8,0x2f), uVar5 < uVar3)) {
      std::__cxx11::string::insert((ulong)unit_string,uVar5 + 1,'\x01');
      uVar3 = std::__cxx11::string::find_first_of(cVar8,0x2f);
      if (uVar3 == 0xffffffffffffffff) {
        std::__cxx11::string::push_back(cVar8);
      }
      else {
        std::__cxx11::string::insert((ulong)unit_string,uVar3,'\x01');
      }
      modfind._7_1_ = true;
      bVar9 = bVar9 || uVar3 < uVar4 + 1;
    }
    if (!bVar9) {
      puVar7 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
      *puVar7 = 0x2a;
      modfind._7_1_ = true;
    }
  }
  return modfind._7_1_;
}

Assistant:

static bool
    isolatePostModifier(std::string& unit_string, const std::string& modifier)
{
    bool modified{false};
    auto modfind = unit_string.find(modifier);
    if (modfind != std::string::npos) {
        auto kloc = unit_string.find_last_not_of(' ', modfind - 1);

        auto nspace = unit_string.find_last_of(" */", kloc);
        auto skip =
            (nspace == 0 || (nspace >= unit_string.size()) ||
             unit_string[nspace] != ' ');
        if (!skip) {
            skip |= skip || isOperator(unit_string[nspace + 1]);
            skip |= skip || isOperator(unit_string[nspace - 1]);
            skip |= skip || unit_string[nspace + 1] == ')';
            skip |= skip || unit_string[nspace + 1] == '-';
            skip |= skip || unit_string[nspace - 1] == ')';
            skip |= skip || unit_string[nspace - 1] == '-';
        }
        if (!skip) {
            auto divloc = unit_string.find_last_of('/', modfind);
            if (divloc < modfind) {
                unit_string.insert(divloc + 1, 1, '(');
                auto divloc2 = unit_string.find_first_of('/', modfind + 1);
                if (divloc2 != std::string::npos) {
                    unit_string.insert(divloc2, 1, ')');
                } else {
                    unit_string.push_back(')');
                }
                modified = true;
                ++nspace;
                skip |= (divloc2 < nspace);
            }
        }
        if (!skip) {
            unit_string[nspace] = '*';
            modified = true;
        }
    }
    return modified;
}